

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_signal.cpp
# Opt level: O2

int main(void)

{
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  int __sig;
  signal<void_()> *this;
  A a;
  signal<void_()> signal;
  A local_90;
  signal<void_()> local_80;
  
  this = &local_80;
  obs::signal<void_()>::signal(this,in_ESI,in_RDX);
  A::A(&local_90,this);
  __sig = (int)this;
  obs::signal<void_()>::operator()<>(&local_80);
  obs::signal<void_()>::operator()<>(&local_80);
  obs::signal<void_()>::~signal(&local_80,__sig,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> signal;
  {
    A a(signal);
    signal();
  }
  signal();
}